

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

StringBuilder * __thiscall Potassco::StringBuilder::appendFormat(StringBuilder *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  long extraout_RAX;
  char *pcVar2;
  void *__maxlen;
  ulong extraout_RAX_00;
  long extraout_RAX_01;
  ulong extraout_RAX_02;
  int *piVar3;
  StringBuilder *in_RCX;
  char *in_RDX;
  char *in_RSI;
  StringBuilder *pSVar4;
  void *pvVar5;
  StringBuilder *in_RDI;
  size_t in_XMM5_Qa;
  StringBuilder *in_XMM5_Qb;
  int n;
  va_list args;
  Buffer buf;
  char small [64];
  size_t x;
  char *p;
  size_t local_198;
  undefined1 local_188 [8];
  StringBuilder *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffef8;
  StringBuilder *in_stack_ffffffffffffff00;
  undefined4 local_98;
  undefined4 local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  Buffer local_80;
  char local_68 [64];
  size_t local_28;
  char *local_20;
  char *local_18;
  StringBuilder *local_10;
  
  if (in_AL != '\0') {
    in_stack_fffffffffffffef8 = in_XMM5_Qa;
    in_stack_ffffffffffffff00 = in_XMM5_Qb;
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = strchr(in_RSI,0x25);
  if (local_20 == (char *)0x0) {
    local_198 = strlen(local_18);
  }
  else {
    local_198 = (long)local_20 - (long)local_18;
  }
  local_28 = local_198;
  if (local_198 != 0) {
    append(in_RCX,in_RDX,(size_t)in_stack_fffffffffffffe80);
    local_18 = local_18 + local_28;
  }
  if (*local_18 != '\0') {
    pSVar4 = in_RDI;
    buffer(in_stack_fffffffffffffe80);
    Buffer::free(&local_80,pSVar4);
    if (extraout_RAX == 0) {
      local_80.head = local_68;
      local_80.used = 0;
      local_80.size = 0x40;
    }
    local_88 = local_188;
    local_90 = &stack0x00000008;
    local_94 = 0x30;
    local_98 = 0x10;
    pcVar2 = Buffer::pos(&local_80);
    Buffer::free(&local_80,pSVar4);
    pvVar5 = __maxlen;
    iVar1 = vsnprintf(pcVar2,(size_t)__maxlen,local_18,&local_98);
    if (0 < iVar1) {
      local_28 = (long)iVar1;
      Buffer::free(&local_80,pvVar5);
      if ((ulong)(long)iVar1 < extraout_RAX_00) {
        if (local_80.head == local_68) {
          append(in_RCX,in_RDX,(size_t)in_stack_fffffffffffffe80);
          return in_RDI;
        }
        grow(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        return in_RDI;
      }
    }
    if (0 < iVar1) {
      pSVar4 = in_RDI;
      grow(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_88 = local_188;
      local_90 = &stack0x00000008;
      local_94 = 0x30;
      local_98 = 0x10;
      pcVar2 = Buffer::pos(&local_80);
      Buffer::free(&local_80,pSVar4);
      pvVar5 = (void *)(extraout_RAX_01 + 1);
      iVar1 = vsnprintf(pcVar2,(size_t)pvVar5,local_18,&local_98);
      local_28 = (long)iVar1;
      Buffer::free(&local_80,pvVar5);
      if (extraout_RAX_02 < (ulong)(long)iVar1) {
        piVar3 = __errno_location();
        *piVar3 = 0x22;
      }
    }
  }
  return in_RDI;
}

Assistant:

StringBuilder& StringBuilder::appendFormat(const char* fmt, ...) {
	const char* p = std::strchr(fmt, '%');
	std::size_t x = p ? static_cast<std::size_t>(p - fmt) : std::strlen(fmt);
	if (x) { append(fmt, x); fmt += x; }
	if (*fmt) {
		char small[64];
		Buffer buf = buffer();
		if (buf.free() == 0) { buf.head = small; buf.used = 0; buf.size = sizeof(small); }
		va_list args;
		va_start(args, fmt);
		int n = vsnprintf(buf.pos(), buf.free(), fmt, args);
		va_end(args);
		if (n > 0 && (x = static_cast<size_t>(n)) < buf.free()) {
			if (buf.head == small) { append(buf.head, x); }
			else                   { grow(x); }
			return *this;
		}
		if (n > 0) {
			buf = grow(static_cast<size_t>(n));
			va_start(args, fmt);
			x = static_cast<size_t>(Potassco::vsnprintf(buf.pos(), buf.free() + 1, fmt, args));
			va_end(args);
			if (x > buf.free()) { errno = ERANGE; }
		}
	}
	return *this;
}